

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgfmt.cpp
# Opt level: O0

void __thiscall icu_63::MessageFormat::setFormat(MessageFormat *this,int32_t n,Format *newFormat)

{
  int iVar1;
  undefined4 extraout_var;
  UErrorCode local_34;
  Format *pFStack_30;
  UErrorCode status;
  Format *new_format;
  int32_t partIndex;
  int32_t formatNumber;
  Format *newFormat_local;
  MessageFormat *pMStack_10;
  int32_t n_local;
  MessageFormat *this_local;
  
  if (-1 < n) {
    new_format._4_4_ = 0;
    new_format._0_4_ = 0;
    _partIndex = newFormat;
    newFormat_local._4_4_ = n;
    pMStack_10 = this;
    while (new_format._0_4_ = nextTopLevelArgStart(this,(int32_t)new_format),
          -1 < (int32_t)new_format) {
      if (newFormat_local._4_4_ == new_format._4_4_) {
        iVar1 = (*(_partIndex->super_UObject)._vptr_UObject[4])();
        pFStack_30 = (Format *)CONCAT44(extraout_var,iVar1);
        if (pFStack_30 == (Format *)0x0) {
          return;
        }
        local_34 = U_ZERO_ERROR;
        setCustomArgStartFormat(this,(int32_t)new_format,pFStack_30,&local_34);
        return;
      }
      new_format._4_4_ = new_format._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void
MessageFormat::setFormat(int32_t n, const Format& newFormat) {

    if (n >= 0) {
        int32_t formatNumber = 0;
        for (int32_t partIndex = 0;
             (partIndex = nextTopLevelArgStart(partIndex)) >= 0;) {
            if (n == formatNumber) {
                Format* new_format = newFormat.clone();
                if (new_format) {
                    UErrorCode status = U_ZERO_ERROR;
                    setCustomArgStartFormat(partIndex, new_format, status);
                }
                return;
            }
            ++formatNumber;
        }
    }
}